

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

void __thiscall
pstore::region::region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::region_builder
          (region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> *this,
          shared_ptr<pstore::file::in_memory> *file,uint64_t full_size,uint64_t minimum_size)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->full_size_ = full_size;
  this->minimum_size_ = minimum_size;
  if ((minimum_size <= full_size) && (full_size % minimum_size == 0)) {
    return;
  }
  assert_failed("full_size >= minimum_size && full_size_ % minimum_size_ == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,0x73);
}

Assistant:

region_builder<File, MemoryMapper>::region_builder (
            std::shared_ptr<File> file, std::uint64_t const full_size,
            std::uint64_t const minimum_size) noexcept
                : file_ (file)
                , full_size_ (full_size)
                , minimum_size_ (minimum_size) {

            PSTORE_ASSERT (full_size >= minimum_size && full_size_ % minimum_size_ == 0);
        }